

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall gl4cts::ShaderSubroutine::Utils::program::program(program *this,Context *context)

{
  this->m_program_object_id = 0;
  this->m_tesselation_control_shader_id = 0;
  this->m_tesselation_evaluation_shader_id = 0;
  this->m_vertex_shader_id = 0;
  this->m_compute_shader_id = 0;
  this->m_fragment_shader_id = 0;
  this->m_geometry_shader_id = 0;
  this->m_program_object_id = 0;
  this->m_context = context;
  return;
}

Assistant:

Utils::program::program(deqp::Context& context)
	: m_compute_shader_id(0)
	, m_fragment_shader_id(0)
	, m_geometry_shader_id(0)
	, m_program_object_id(0)
	, m_tesselation_control_shader_id(0)
	, m_tesselation_evaluation_shader_id(0)
	, m_vertex_shader_id(0)
	, m_context(context)
{
	/* Nothing to be done here */
}